

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<kratos::StmtBlock,_std::shared_ptr<kratos::StmtBlock>,_kratos::Stmt>::
     init_holder<kratos::Stmt>
               (instance *inst,value_and_holder *v_h,holder_type *param_3,
               enable_shared_from_this<kratos::Stmt> *param_4)

{
  _Atomic_word *p_Var1;
  byte *pbVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  void **ppvVar5;
  instance *piVar6;
  byte bVar7;
  int iVar8;
  undefined8 *puVar9;
  void *pvVar10;
  holder_type *phVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar12;
  
  puVar9 = (undefined8 *)((long)*v_h->vh + 0x68);
  if (*v_h->vh == (void *)0x0) {
    puVar9 = (undefined8 *)0x0;
  }
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar9[1];
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    phVar11 = (holder_type *)*puVar9;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
    iVar8 = p_Var4->_M_use_count;
    do {
      if (iVar8 == 0) {
        phVar11 = (holder_type *)0x0;
        this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_002cf255;
      }
      param_3 = (holder_type *)(ulong)(iVar8 + 1U);
      LOCK();
      iVar3 = p_Var4->_M_use_count;
      bVar12 = iVar8 == iVar3;
      if (bVar12) {
        p_Var4->_M_use_count = iVar8 + 1U;
        iVar3 = iVar8;
      }
      iVar8 = iVar3;
      UNLOCK();
    } while (!bVar12);
    param_3 = (holder_type *)0x0;
    this = p_Var4;
    if (p_Var4->_M_use_count == 0) {
      phVar11 = param_3;
    }
LAB_002cf255:
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])(p_Var4,v_h,param_3);
    }
    if ((phVar11 == (holder_type *)0x0) ||
       (pvVar10 = (void *)__dynamic_cast(phVar11,&kratos::Stmt::typeinfo,
                                         &kratos::StmtBlock::typeinfo,0), pvVar10 == (void *)0x0)) {
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
    }
    else {
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      ppvVar5 = v_h->vh;
      ppvVar5[1] = pvVar10;
      ppvVar5[2] = this;
      piVar6 = v_h->inst;
      if ((piVar6->field_0x30 & 2) == 0) {
        pbVar2 = (piVar6->field_1).nonsimple.status + v_h->index;
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        piVar6->field_0x30 = piVar6->field_0x30 | 4;
      }
    }
  }
  bVar7 = v_h->inst->field_0x30;
  if ((bVar7 & 2) == 0) {
    bVar7 = (v_h->inst->field_1).nonsimple.status[v_h->index] & 1;
  }
  else {
    bVar7 = bVar7 & 4;
  }
  if ((bVar7 == 0) && ((inst->field_0x30 & 1) != 0)) {
    std::__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::StmtBlock,void>
              ((__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2> *)(v_h->vh + 1),
               (StmtBlock *)*v_h->vh);
    piVar6 = v_h->inst;
    if ((piVar6->field_0x30 & 2) == 0) {
      pbVar2 = (piVar6->field_1).nonsimple.status + v_h->index;
      *pbVar2 = *pbVar2 | 1;
    }
    else {
      piVar6->field_0x30 = piVar6->field_0x30 | 4;
    }
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type * /* unused */, const std::enable_shared_from_this<T> * /* dummy */) {

        auto sh = std::dynamic_pointer_cast<typename holder_type::element_type>(
                detail::try_get_shared_from_this(v_h.value_ptr<type>()));
        if (sh) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(std::move(sh));
            v_h.set_holder_constructed();
        }

        if (!v_h.holder_constructed() && inst->owned) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }